

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O0

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:666:55)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:666:55)>
       *this,model *to)

{
  model *to_local;
  impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:666:55)>
  *this_local;
  
  impl((impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:666:55)>
        *)to,this);
  return;
}

Assistant:

void move(model* to) override { new (to) impl<F>(std::move(*this)); }